

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_ClassArray<ON_3dmConstructionPlane>::Append
          (ON_ClassArray<ON_3dmConstructionPlane> *this,ON_3dmConstructionPlane *x)

{
  int iVar1;
  undefined1 local_c8 [8];
  ON_3dmConstructionPlane temp;
  int s;
  int newcapacity;
  ON_3dmConstructionPlane *x_local;
  ON_ClassArray<ON_3dmConstructionPlane> *this_local;
  
  if (this->m_count == this->m_capacity) {
    temp.m_name.m_s._4_4_ = NewCapacity(this);
    if (((this->m_a != (ON_3dmConstructionPlane *)0x0) &&
        (temp.m_name.m_s._0_4_ = (int)(((long)x - (long)this->m_a) / 0xa8),
        -1 < (int)temp.m_name.m_s)) && ((int)temp.m_name.m_s < this->m_capacity)) {
      ON_3dmConstructionPlane::ON_3dmConstructionPlane((ON_3dmConstructionPlane *)local_c8);
      ON_3dmConstructionPlane::operator=((ON_3dmConstructionPlane *)local_c8,x);
      Reserve(this,(long)temp.m_name.m_s._4_4_);
      if (this->m_a == (ON_3dmConstructionPlane *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar1 = this->m_count;
        this->m_count = iVar1 + 1;
        ON_3dmConstructionPlane::operator=(this->m_a + iVar1,(ON_3dmConstructionPlane *)local_c8);
      }
      ON_3dmConstructionPlane::~ON_3dmConstructionPlane((ON_3dmConstructionPlane *)local_c8);
      return;
    }
    Reserve(this,(long)temp.m_name.m_s._4_4_);
    if (this->m_a == (ON_3dmConstructionPlane *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  ON_3dmConstructionPlane::operator=(this->m_a + iVar1,x);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}